

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.cpp
# Opt level: O3

bool duckdb::VectorStringToList::SplitStringList
               (string_t *input,string_t *child_data,idx_t *child_start,Vector *child)

{
  char *pcVar1;
  bool bVar2;
  idx_t iVar3;
  ulong *puVar4;
  idx_t *piVar5;
  ulong uVar6;
  ulong uVar7;
  char *buf;
  idx_t *pos;
  bool bVar8;
  string_t sVar9;
  idx_t len;
  optional_idx start_pos;
  SplitStringListOperation state;
  ulong local_88;
  ulong local_80;
  StringCastInputState local_78;
  optional_idx local_58;
  SplitStringListOperation local_50;
  idx_t local_38;
  
  piVar5 = &local_88;
  local_50.child_data = child_data;
  local_50.entry_count = child_start;
  local_50.child = child;
  local_80 = (ulong)(input->value).pointer.length;
  if (local_80 < 0xd) {
    buf = (input->value).pointer.prefix;
  }
  else {
    buf = (input->value).pointer.ptr;
  }
  puVar4 = &local_80;
  local_78.buf = buf;
  local_78.pos = &local_88;
  local_78.len = puVar4;
  local_78.escaped = false;
  uVar7 = 0;
  uVar6 = uVar7;
  if (local_80 != 0) {
    do {
      if ((4 < (byte)buf[uVar6] - 9) && (uVar7 = uVar6, buf[uVar6] != 0x20)) break;
      uVar6 = uVar6 + 1;
      uVar7 = local_80;
    } while (local_80 != uVar6);
    local_78.escaped = false;
  }
  if ((uVar7 == local_80) || (buf[uVar7] != '[')) {
LAB_007e5d49:
    bVar8 = false;
  }
  else {
    uVar7 = uVar7 + 1;
    local_88 = uVar7;
    if (uVar7 < local_80) {
      do {
        if ((4 < (byte)buf[local_88] - 9) && (uVar7 = local_88, buf[local_88] != 0x20)) break;
        local_88 = local_88 + 1;
        uVar7 = local_80;
      } while (local_80 != local_88);
      local_78.escaped = false;
    }
    local_78.escaped = false;
    if (uVar7 < local_80) {
      bVar8 = false;
      do {
        local_58.index = 0xffffffffffffffff;
        while (((local_88 < local_80 && (buf[local_88] != ',')) && (buf[local_88] != ']'))) {
          bVar2 = ValueStateTransition(&local_78,&local_58,&local_38);
          if (!bVar2) goto LAB_007e5d49;
        }
        if (local_88 == local_80) goto LAB_007e5d49;
        if (buf[local_88] == ']') {
          if (local_58.index != 0xffffffffffffffff) {
LAB_007e5c8c:
            iVar3 = optional_idx::GetIndex(&local_58);
            SplitStringListOperation::HandleValue(&local_50,buf,iVar3,local_38 + 1);
            goto LAB_007e5cdf;
          }
          if (bVar8) goto LAB_007e5cac;
          bVar8 = false;
        }
        else {
          if (local_58.index != 0xffffffffffffffff) goto LAB_007e5c8c;
LAB_007e5cac:
          sVar9 = HandleString<true>(local_50.child,buf,0,0);
          iVar3 = *local_50.entry_count;
          *(long *)&local_50.child_data[iVar3].value = sVar9.value._0_8_;
          local_50.child_data[iVar3].value.pointer.ptr = sVar9.value._8_8_;
          *local_50.entry_count = *local_50.entry_count + 1;
LAB_007e5cdf:
          bVar8 = true;
        }
        puVar4 = local_78.len;
        piVar5 = local_78.pos;
        pcVar1 = local_78.buf;
        uVar7 = local_88;
        if (buf[local_88] == ']') break;
        local_88 = local_88 + 1;
        uVar7 = *local_78.pos;
        if (uVar7 < *local_78.len) {
          do {
            if ((4 < (byte)pcVar1[uVar7] - 9) && (pcVar1[uVar7] != 0x20)) break;
            uVar7 = uVar7 + 1;
            *piVar5 = uVar7;
            local_78.escaped = false;
          } while (uVar7 < *puVar4);
        }
        uVar7 = local_88;
      } while (local_88 < local_80);
    }
    local_88 = uVar7 + 1;
    uVar7 = *piVar5;
    if (uVar7 < *puVar4) {
      do {
        if ((4 < (byte)local_78.buf[uVar7] - 9) && (local_78.buf[uVar7] != 0x20)) break;
        uVar7 = uVar7 + 1;
        *piVar5 = uVar7;
      } while (uVar7 < *puVar4);
    }
    bVar8 = local_88 == local_80;
  }
  return bVar8;
}

Assistant:

bool VectorStringToList::SplitStringList(const string_t &input, string_t *child_data, idx_t &child_start,
                                         Vector &child) {
	SplitStringListOperation state(child_data, child_start, child);
	return SplitStringListInternal<SplitStringListOperation>(input, state);
}